

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

void __thiscall soplex::SVectorBase<double>::add(SVectorBase<double> *this,int n,int *i,double *v)

{
  double dVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  long lVar4;
  int iVar5;
  
  if (0 < n) {
    iVar2 = this->memused;
    pNVar3 = this->m_elem + iVar2;
    iVar5 = 0;
    for (lVar4 = 0; n != (int)lVar4; lVar4 = lVar4 + 1) {
      dVar1 = v[lVar4];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pNVar3->idx = i[lVar4];
        pNVar3->val = dVar1;
        pNVar3 = pNVar3 + 1;
        iVar5 = iVar5 + 1;
      }
    }
    this->memused = iVar5 + iVar2;
  }
  return;
}

Assistant:

void add(int n, const int i[], const R v[])
   {
      assert(n + size() <= max());

      if(n <= 0)
         return;

      int newnnz = 0;

      Nonzero<R>* e = m_elem + size();

      while(n--)
      {
         if(*v != 0.0)
         {
            assert(e != nullptr);
            e->idx = *i;
            e->val = *v;
            e++;
            ++newnnz;
         }

         i++;
         v++;
      }

      set_size(size() + newnnz);
   }